

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O0

ZyanStatus ZydisNodeHandlerVEX(ZydisDecodedInstruction *instruction,ZyanU16 *index)

{
  ZyanU16 *index_local;
  ZydisDecodedInstruction *instruction_local;
  
  if (instruction == (ZydisDecodedInstruction *)0x0) {
    __assert_fail("instruction",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0xdeb,
                  "ZyanStatus ZydisNodeHandlerVEX(const ZydisDecodedInstruction *, ZyanU16 *)");
  }
  if (index == (ZyanU16 *)0x0) {
    __assert_fail("index",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0xdec,
                  "ZyanStatus ZydisNodeHandlerVEX(const ZydisDecodedInstruction *, ZyanU16 *)");
  }
  if (instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_LEGACY) {
    *index = 0;
  }
  else {
    if (instruction->encoding != ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xdf8,
                    "ZyanStatus ZydisNodeHandlerVEX(const ZydisDecodedInstruction *, ZyanU16 *)");
    }
    if ((instruction->attributes & 0x10) == 0) {
      __assert_fail("instruction->attributes & (1ULL << 4)",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xdf4,
                    "ZyanStatus ZydisNodeHandlerVEX(const ZydisDecodedInstruction *, ZyanU16 *)");
    }
    *index = (ushort)(instruction->raw).field_3.rex.B +
             (ushort)(instruction->raw).field_3.xop.pp * 4 + 1;
  }
  return 0x100000;
}

Assistant:

static ZyanStatus ZydisNodeHandlerVEX(const ZydisDecodedInstruction* instruction, ZyanU16* index)
{
    ZYAN_ASSERT(instruction);
    ZYAN_ASSERT(index);

    switch (instruction->encoding)
    {
    case ZYDIS_INSTRUCTION_ENCODING_LEGACY:
        *index = 0;
        break;
    case ZYDIS_INSTRUCTION_ENCODING_VEX:
        ZYAN_ASSERT(instruction->attributes & ZYDIS_ATTRIB_HAS_VEX);
        *index = instruction->raw.vex.m_mmmm + (instruction->raw.vex.pp << 2) + 1;
        break;
    default:
        ZYAN_UNREACHABLE;
    }
    return ZYAN_STATUS_SUCCESS;
}